

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int cuddZddTreeSifting(DdManager *table,Cudd_ReorderingType method)

{
  MtrNode *pMVar1;
  undefined1 auVar2 [16];
  int iVar3;
  MtrNode *treenode;
  uint *puVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pMVar1 = table->treeZ;
  treenode = pMVar1;
  if (pMVar1 == (MtrNode *)0x0) {
    treenode = Mtr_InitGroupTree(0,table->sizeZ);
    table->treeZ = treenode;
    treenode->index = *table->invpermZ;
  }
  auVar2 = _DAT_008403e0;
  iVar3 = table->sizeZ;
  if (0 < (long)iVar3) {
    lVar5 = (long)iVar3 + -1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    puVar4 = &table->subtableZ->next;
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_008403e0;
    auVar8 = _DAT_008403d0;
    do {
      auVar9 = auVar8 ^ auVar2;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        *puVar4 = (uint)uVar6;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        puVar4[0xe] = (uint)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar5 + 2;
      puVar4 = puVar4 + 0x1c;
    } while ((iVar3 + 1U & 0xfffffffe) != uVar6);
  }
  iVar3 = zddTreeSiftingAux(table,treenode,method);
  if (pMVar1 == (MtrNode *)0x0) {
    Cudd_FreeZddTree(table);
  }
  return iVar3;
}

Assistant:

int
cuddZddTreeSifting(
  DdManager * table /* DD table */,
  Cudd_ReorderingType method /* reordering method for the groups of leaves */)
{
    int i;
    int nvars;
    int result;
    int tempTree;

    /* If no tree is provided we create a temporary one in which all
    ** variables are in a single group. After reordering this tree is
    ** destroyed.
    */
    tempTree = table->treeZ == NULL;
    if (tempTree) {
        table->treeZ = Mtr_InitGroupTree(0,table->sizeZ);
        table->treeZ->index = table->invpermZ[0];
    }
    nvars = table->sizeZ;

#ifdef DD_DEBUG
    if (pr > 0 && !tempTree)
        (void) fprintf(table->out,"cuddZddTreeSifting:");
    Mtr_PrintGroups(table->treeZ,pr <= 0);
#endif
#if 0
    /* Debugging code. */
    if (table->tree && table->treeZ) {
        (void) fprintf(table->out,"\n");
        Mtr_PrintGroups(table->tree, 0);
        cuddPrintVarGroups(table,table->tree,0,0);
        for (i = 0; i < table->size; i++) {
            (void) fprintf(table->out,"%s%d",
                           (i == 0) ? "" : ",", table->invperm[i]);
        }
        (void) fprintf(table->out,"\n");
        for (i = 0; i < table->size; i++) {
            (void) fprintf(table->out,"%s%d",
                           (i == 0) ? "" : ",", table->perm[i]);
        }
        (void) fprintf(table->out,"\n\n");
        Mtr_PrintGroups(table->treeZ,0);
        cuddPrintVarGroups(table,table->treeZ,1,0);
        for (i = 0; i < table->sizeZ; i++) {
            (void) fprintf(table->out,"%s%d",
                           (i == 0) ? "" : ",", table->invpermZ[i]);
        }
        (void) fprintf(table->out,"\n");
        for (i = 0; i < table->sizeZ; i++) {
            (void) fprintf(table->out,"%s%d",
                           (i == 0) ? "" : ",", table->permZ[i]);
        }
        (void) fprintf(table->out,"\n");
    }
    /* End of debugging code. */
#endif
#ifdef DD_STATS
    extsymmcalls = 0;
    extsymm = 0;
    secdiffcalls = 0;
    secdiff = 0;
    secdiffmisfire = 0;

    (void) fprintf(table->out,"\n");
    if (!tempTree)
        (void) fprintf(table->out,"#:IM_NODES  %8d: group tree nodes\n",
                       zddCountInternalMtrNodes(table,table->treeZ));
#endif

    /* Initialize the group of each subtable to itself. Initially
    ** there are no groups. Groups are created according to the tree
    ** structure in postorder fashion.
    */
    for (i = 0; i < nvars; i++)
        table->subtableZ[i].next = i;

    /* Reorder. */
    result = zddTreeSiftingAux(table, table->treeZ, method);

#ifdef DD_STATS         /* print stats */
    if (!tempTree && method == CUDD_REORDER_GROUP_SIFT &&
        (table->groupcheck == CUDD_GROUP_CHECK7 ||
         table->groupcheck == CUDD_GROUP_CHECK5)) {
        (void) fprintf(table->out,"\nextsymmcalls = %d\n",extsymmcalls);
        (void) fprintf(table->out,"extsymm = %d",extsymm);
    }
    if (!tempTree && method == CUDD_REORDER_GROUP_SIFT &&
        table->groupcheck == CUDD_GROUP_CHECK7) {
        (void) fprintf(table->out,"\nsecdiffcalls = %d\n",secdiffcalls);
        (void) fprintf(table->out,"secdiff = %d\n",secdiff);
        (void) fprintf(table->out,"secdiffmisfire = %d",secdiffmisfire);
    }
#endif

    if (tempTree)
        Cudd_FreeZddTree(table);
    return(result);

}